

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_erase(wchar_t x,wchar_t y,wchar_t n)

{
  int iVar1;
  int *piVar2;
  wchar_t *pwVar3;
  int *piVar4;
  wchar_t *pwVar5;
  errr eVar6;
  wchar_t oc;
  wchar_t oa;
  wchar_t *scr_tcc;
  int *scr_taa;
  wchar_t *scr_cc;
  int *scr_aa;
  wchar_t x2;
  wchar_t x1;
  wchar_t w;
  wchar_t i;
  wchar_t n_local;
  wchar_t y_local;
  wchar_t x_local;
  
  iVar1 = Term->wid;
  scr_aa._4_4_ = L'\xffffffff';
  scr_aa._0_4_ = L'\xffffffff';
  eVar6 = Term_gotoxy(x,y);
  if (eVar6 == 0) {
    w = n;
    if (iVar1 < x + n) {
      w = iVar1 - x;
    }
    piVar2 = Term->scr->a[y];
    pwVar3 = Term->scr->c[y];
    piVar4 = Term->scr->ta[y];
    pwVar5 = Term->scr->tc[y];
    n_local = x;
    for (x1 = L'\0'; x1 < w; x1 = x1 + L'\x01') {
      if ((piVar2[n_local] != 1) || (pwVar3[n_local] != L' ')) {
        piVar2[n_local] = 1;
        pwVar3[n_local] = L' ';
        piVar4[n_local] = 0;
        pwVar5[n_local] = L'\0';
        if (scr_aa._4_4_ < L'\0') {
          scr_aa._4_4_ = n_local;
        }
        scr_aa._0_4_ = n_local;
      }
      n_local = n_local + L'\x01';
    }
    if (L'\xffffffff' < scr_aa._4_4_) {
      if (y < Term->y1) {
        Term->y1 = y;
      }
      if (Term->y2 < y) {
        Term->y2 = y;
      }
      if (scr_aa._4_4_ < Term->x1[y]) {
        Term->x1[y] = scr_aa._4_4_;
      }
      if (Term->x2[y] < (wchar_t)scr_aa) {
        Term->x2[y] = (wchar_t)scr_aa;
      }
    }
    y_local = L'\0';
  }
  else {
    y_local = L'\xffffffff';
  }
  return y_local;
}

Assistant:

errr Term_erase(int x, int y, int n)
{
	int i;

	int w = Term->wid;
	/* int h = Term->hgt; */

	int x1 = -1;
	int x2 = -1;

	int *scr_aa;
	wchar_t *scr_cc;

	int *scr_taa;
	wchar_t *scr_tcc;

	/* Place cursor */
	if (Term_gotoxy(x, y)) return (-1);

	/* Force legal size */
	if (x + n > w) n = w - x;

	/* Fast access */
	scr_aa = Term->scr->a[y];
	scr_cc = Term->scr->c[y];

	scr_taa = Term->scr->ta[y];
	scr_tcc = Term->scr->tc[y];

	/* Scan every column */
	for (i = 0; i < n; i++, x++) {
		int oa = scr_aa[x];
		wchar_t oc = scr_cc[x];

		/* Hack -- Ignore "non-changes" */
		if ((oa == COLOUR_WHITE) && (oc == ' ')) continue;

		/* Save the "literal" information */
		scr_aa[x] = COLOUR_WHITE;
		scr_cc[x] = ' ';

		scr_taa[x] = 0;
		scr_tcc[x] = 0;

		/* Track minimum changed column */
		if (x1 < 0) x1 = x;

		/* Track maximum changed column */
		x2 = x;
	}

	/* Expand the "change area" as needed */
	if (x1 >= 0) {
		/* Check for new min/max row info */
		if (y < Term->y1) Term->y1 = y;
		if (y > Term->y2) Term->y2 = y;

		/* Check for new min/max col info in this row */
		if (x1 < Term->x1[y]) Term->x1[y] = x1;
		if (x2 > Term->x2[y]) Term->x2[y] = x2;
	}

	/* Success */
	return (0);
}